

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

char * upb_MtDataEncoder_StartOneof(upb_MtDataEncoder *e,char *ptr)

{
  char *pcVar1;
  
  *(char **)e->internal = ptr;
  pcVar1 = upb_MtDataEncoder_Put(e,ptr,""[(ulong)(*(int *)(e->internal + 0x14) != 0) * 0x20 + 0x3e])
  ;
  e->internal[0x14] = '\x01';
  e->internal[0x15] = '\0';
  e->internal[0x16] = '\0';
  e->internal[0x17] = '\0';
  return pcVar1;
}

Assistant:

char* upb_MtDataEncoder_StartOneof(upb_MtDataEncoder* e, char* ptr) {
  upb_MtDataEncoderInternal* in = upb_MtDataEncoder_GetInternal(e, ptr);
  if (in->state.msg_state.oneof_state == kUpb_OneofState_NotStarted) {
    ptr = upb_MtDataEncoder_Put(e, ptr, _upb_FromBase92(kUpb_EncodedValue_End));
  } else {
    ptr = upb_MtDataEncoder_Put(
        e, ptr, _upb_FromBase92(kUpb_EncodedValue_OneofSeparator));
  }
  in->state.msg_state.oneof_state = kUpb_OneofState_StartedOneof;
  return ptr;
}